

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_2::IsEnabledByExtension(ValidationState_t *_,uint32_t capability)

{
  bool bVar1;
  spv_operand_desc operand_desc;
  ExtensionSet operand_exts;
  
  operand_desc = (spv_operand_desc)0x0;
  AssemblyGrammar::lookupOperand(&_->grammar_,SPV_OPERAND_TYPE_CAPABILITY,capability,&operand_desc);
  if (operand_desc != (spv_operand_desc)0x0) {
    EnumSet<spvtools::Extension>::EnumSet
              (&operand_exts,operand_desc->numExtensions,operand_desc->extensions);
    if (operand_exts.size_ == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = ValidationState_t::HasAnyOfExtensions(_,&operand_exts);
    }
    std::
    _Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
    ::~_Vector_base((_Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                     *)&operand_exts);
    return bVar1;
  }
  __assert_fail("operand_desc",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                ,0xef,
                "bool spvtools::val::(anonymous namespace)::IsEnabledByExtension(ValidationState_t &, uint32_t)"
               );
}

Assistant:

bool IsEnabledByExtension(ValidationState_t& _, uint32_t capability) {
  spv_operand_desc operand_desc = nullptr;
  _.grammar().lookupOperand(SPV_OPERAND_TYPE_CAPABILITY, capability,
                            &operand_desc);

  // operand_desc is expected to be not null, otherwise validator would have
  // failed at an earlier stage. This 'assert' is 'just in case'.
  assert(operand_desc);

  ExtensionSet operand_exts(operand_desc->numExtensions,
                            operand_desc->extensions);
  if (operand_exts.empty()) return false;

  return _.HasAnyOfExtensions(operand_exts);
}